

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

FunctionSignature * __thiscall
Jinx::Impl::Parser::ParseFunctionSignature
          (FunctionSignature *__return_storage_ptr__,Parser *this,VisibilityType scope,
          SignatureParseMode mode)

{
  initializer_list<Jinx::Impl::SymbolType> symbols;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  pointer pSVar4;
  reference __str;
  size_type sVar5;
  element_type *peVar6;
  String *libraryName;
  undefined1 local_1e0 [8];
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> n;
  iterator __end5;
  iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
  *__range5;
  String name;
  char *local_168;
  SymbolType local_15c;
  iterator local_158;
  undefined8 local_150;
  undefined1 local_148 [8];
  String paramName;
  undefined1 local_118 [8];
  FunctionSignaturePart part;
  undefined1 local_50 [8];
  FunctionSignatureParts signatureParts;
  int local_30;
  int optionalNameCountSection;
  int parsedNameCountSection;
  int optionalNameCount;
  int parsedNameCount;
  bool parsedNonKeywordName;
  bool parsedParameter;
  SignatureParseMode mode_local;
  VisibilityType scope_local;
  Parser *this_local;
  
  bVar2 = Check(this,NewLine);
  if (bVar2) {
    Error<>(this,"Empty function signature");
    FunctionSignature::FunctionSignature(__return_storage_ptr__);
  }
  else {
    bVar2 = false;
    bVar1 = false;
    parsedNameCountSection = 0;
    optionalNameCountSection = 0;
    local_30 = 0;
    signatureParts.
    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::
    vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>::
    vector((vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
            *)local_50);
    do {
      bVar3 = Check(this,NewLine);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        if (((bVar1) || (parsedNameCountSection != 1)) ||
           (sVar5 = std::
                    vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
                    ::size((vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
                            *)local_50), sVar5 != 1)) {
          if (parsedNameCountSection == optionalNameCountSection) {
            Error<>(this,"Function signature must have at least one non-optional name part");
            FunctionSignature::FunctionSignature(__return_storage_ptr__);
            paramName.field_2._8_4_ = 1;
          }
          else {
            peVar6 = std::
                     __shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m_library);
            libraryName = Library::GetName_abi_cxx11_(peVar6);
            FunctionSignature::FunctionSignature
                      (__return_storage_ptr__,scope,libraryName,(FunctionSignatureParts *)local_50);
            paramName.field_2._8_4_ = 1;
          }
        }
        else {
          Error<>(this,"Function signature cannot match keyword");
          FunctionSignature::FunctionSignature(__return_storage_ptr__);
          paramName.field_2._8_4_ = 1;
        }
        break;
      }
      FunctionSignaturePart::FunctionSignaturePart((FunctionSignaturePart *)local_118);
      bVar3 = Accept(this,CurlyOpen);
      if (bVar3) {
        if (bVar2) {
          Error<>(this,"Functions cannot have multiple variables without a name separating them");
          FunctionSignature::FunctionSignature(__return_storage_ptr__);
          paramName.field_2._8_4_ = 1;
        }
        else if ((parsedNameCountSection == 0) ||
                (signatureParts.
                 super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < local_30)) {
          part.staticArena._136_4_ = 1;
          bVar3 = CheckValueType(this);
          if (bVar3) {
            part.partType = ParseValueType(this);
          }
          bVar3 = CheckName(this);
          if (bVar3) {
            local_15c = CurlyClose;
            local_158 = &local_15c;
            local_150 = 1;
            symbols._M_len = 1;
            symbols._M_array = local_158;
            ParseMultiName_abi_cxx11_((String *)local_148,this,symbols);
            peVar6 = std::
                     __shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m_library);
            bVar3 = Library::PropertyNameExists(peVar6,(String *)local_148);
            if (bVar3) {
              local_168 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                                    ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                      *)local_148);
              Error<char_const*>(this,
                                 "Function parameter name \'%s\' already exists as a property name",
                                 &local_168);
              FunctionSignature::FunctionSignature(__return_storage_ptr__);
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                           *)&part.valueType,(value_type *)local_148);
            }
            paramName.field_2._9_3_ = 0;
            paramName.field_2._M_local_buf[8] = bVar3;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                          local_148);
            if (paramName.field_2._8_4_ == 0) goto LAB_00149bc7;
          }
          else if (mode == FunctionDefinition) {
            Error<>(this,"No variable name found in function signature");
            FunctionSignature::FunctionSignature(__return_storage_ptr__);
            paramName.field_2._8_4_ = 1;
          }
          else {
LAB_00149bc7:
            Expect(this,CurlyClose,(char *)0x0);
            bVar2 = true;
            local_30 = 0;
            signatureParts.
            super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
LAB_00149f76:
            std::
            vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
            ::push_back((vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
                         *)local_50,(value_type *)local_118);
            paramName.field_2._8_4_ = 0;
          }
        }
        else {
          Error<>(this,"Arguments can\'t be separated soley by optional parameters");
          FunctionSignature::FunctionSignature(__return_storage_ptr__);
          paramName.field_2._8_4_ = 1;
        }
      }
      else {
        part.staticArena._140_1_ = Accept(this,ParenOpen);
        bVar3 = CheckFunctionNamePart(this);
        if (bVar3) {
          parsedNameCountSection = parsedNameCountSection + 1;
          local_30 = local_30 + 1;
          pSVar4 = __gnu_cxx::
                   __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                   ::operator->(&this->m_currentSymbol);
          bVar3 = IsKeyword(pSVar4->type);
          if (!bVar3) {
            bVar1 = true;
          }
          part.staticArena._136_4_ = 0;
          ParseFunctionNamePart_abi_cxx11_((String *)((long)&name.field_2 + 8),this);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                       *)&part.valueType,(value_type *)((long)&name.field_2 + 8));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                        ((long)&name.field_2 + 8));
          do {
            bVar3 = Accept(this,ForwardSlash);
            if (!bVar3) {
              if ((part.staticArena._140_1_ & 1) != 0) {
                optionalNameCountSection = optionalNameCountSection + 1;
                signatureParts.
                super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     signatureParts.
                     super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
                bVar3 = Expect(this,ParenClose,(char *)0x0);
                if (!bVar3) {
                  Error<>(this,"Expected closing parentheses for optional function name part");
                  FunctionSignature::FunctionSignature(__return_storage_ptr__);
                  paramName.field_2._8_4_ = 1;
                  break;
                }
              }
              bVar2 = false;
              goto LAB_00149f76;
            }
            bVar3 = CheckFunctionNamePart(this);
            if (!bVar3) {
              Error<>(this,"Invalid name in function signature");
              FunctionSignature::FunctionSignature(__return_storage_ptr__);
              paramName.field_2._8_4_ = 1;
              break;
            }
            ParseFunctionNamePart_abi_cxx11_((String *)&__range5,this);
            __end5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                              *)&part.valueType);
            n.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                        *)&part.valueType);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end5,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
                                               *)((long)&n.field_2 + 8)), bVar3) {
              __str = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
                      ::operator*(&__end5);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                           local_1e0,__str);
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                       *)local_1e0,
                                      (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                       *)&__range5);
              if (bVar3) {
                Error<>(this,"Duplicate alternative name in function signature");
                FunctionSignature::FunctionSignature(__return_storage_ptr__);
              }
              paramName.field_2._9_3_ = 0;
              paramName.field_2._M_local_buf[8] = bVar3;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                            local_1e0);
              if (paramName.field_2._8_4_ != 0) goto LAB_00149ed0;
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
              ::operator++(&__end5);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                         *)&part.valueType,(value_type *)&__range5);
            paramName.field_2._8_4_ = 0;
LAB_00149ed0:
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                          &__range5);
          } while (paramName.field_2._8_4_ == 0);
        }
        else {
          Error<>(this,"Invalid name in function signature");
          FunctionSignature::FunctionSignature(__return_storage_ptr__);
          paramName.field_2._8_4_ = 1;
        }
      }
      FunctionSignaturePart::~FunctionSignaturePart((FunctionSignaturePart *)local_118);
    } while (paramName.field_2._8_4_ == 0);
    std::
    vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>::
    ~vector((vector<Jinx::Impl::FunctionSignaturePart,_Jinx::Allocator<Jinx::Impl::FunctionSignaturePart>_>
             *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t FunctionSignature Parser::ParseFunctionSignature(VisibilityType scope, SignatureParseMode mode)
	{
		if (Check(SymbolType::NewLine))
		{
			Error("Empty function signature");
			return FunctionSignature();
		}
		bool parsedParameter = false;
		bool parsedNonKeywordName = false;
		int parsedNameCount = 0;
		int optionalNameCount = 0;
		int parsedNameCountSection = 0;
		int optionalNameCountSection = 0;
		FunctionSignatureParts signatureParts;
		while (!Check(SymbolType::NewLine))
		{
			FunctionSignaturePart part;
			if (Accept(SymbolType::CurlyOpen))
			{
				if (parsedParameter)
				{
					Error("Functions cannot have multiple variables without a name separating them");
					return FunctionSignature();
				}
				if (parsedNameCount && parsedNameCountSection <= optionalNameCountSection)
				{
					Error("Arguments can't be separated soley by optional parameters");
					return FunctionSignature();
				}
				part.partType = FunctionSignaturePartType::Parameter;
				if (CheckValueType())
				{
					part.valueType = ParseValueType();
				}
				if (CheckName())
				{
					String paramName = ParseMultiName({ SymbolType::CurlyClose });
					if (m_library->PropertyNameExists(paramName))
					{
						Error("Function parameter name '%s' already exists as a property name", paramName.c_str());
						return FunctionSignature();
					}
					part.names.push_back(paramName);
				}
				else if (mode == SignatureParseMode::FunctionDefinition)
				{
					Error("No variable name found in function signature");
					return FunctionSignature();
				}
				Expect(SymbolType::CurlyClose);
				parsedParameter = true;
				parsedNameCountSection = 0;
				optionalNameCountSection = 0;
			}
			else
			{
				part.optional = Accept(SymbolType::ParenOpen);
				if (!CheckFunctionNamePart())
				{
					Error("Invalid name in function signature");
					return FunctionSignature();
				}
				parsedNameCount++;
				parsedNameCountSection++;
				if (IsKeyword(m_currentSymbol->type) == false)
					parsedNonKeywordName = true;
				part.partType = FunctionSignaturePartType::Name;
				part.names.push_back(ParseFunctionNamePart());
				while (Accept(SymbolType::ForwardSlash))
				{
					if (!CheckFunctionNamePart())
					{
						Error("Invalid name in function signature");
						return FunctionSignature();
					}
					auto name = ParseFunctionNamePart();
					for (auto n : part.names)
					{
						if (n == name)
						{
							Error("Duplicate alternative name in function signature");
							return FunctionSignature();
						}
					}
					part.names.push_back(name);
				}
				if (part.optional)
				{
					optionalNameCount++;
					optionalNameCountSection++;
					if (!Expect(SymbolType::ParenClose))
					{
						Error("Expected closing parentheses for optional function name part");
						return FunctionSignature();
					}
				}
				parsedParameter = false;
			}
			signatureParts.push_back(part);
		}

		// Check for function signature validity with matching keywords
		if (!parsedNonKeywordName)
		{
			if (parsedNameCount == 1 && signatureParts.size() == 1)
			{
				Error("Function signature cannot match keyword");
				return FunctionSignature();
			}
		}

		// Check to make sure the function has at least one non-optional keyword part
		if (parsedNameCount == optionalNameCount)
		{
			Error("Function signature must have at least one non-optional name part");
			return FunctionSignature();
		}

		// Create and return the function signature
		return FunctionSignature(scope, m_library->GetName(), signatureParts);
	}